

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265e_vepu511.c
# Opt level: O2

MPP_RET vepu511_h265_setup_hal_bufs(H265eV511HalContext *ctx)

{
  uint uVar1;
  int iVar2;
  Vepu541Fmt VVar3;
  int iVar4;
  VepuFmtCfg *cfg;
  MppEncCfgSet *pMVar5;
  MppEncRefCfg ref;
  MppEncCpbInfo *pMVar6;
  MppEncCfgSet *pMVar7;
  MPP_RET MVar8;
  RK_S32 i;
  int iVar9;
  long lVar10;
  RK_S32 RVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  MppBuffer *buffer;
  size_t local_58;
  long local_50;
  long local_48;
  long local_40;
  
  cfg = (VepuFmtCfg *)ctx->input_fmt;
  pMVar5 = ctx->cfg;
  ref = pMVar5->ref_cfg;
  uVar1 = ctx->max_buf_cnt;
  iVar2 = (pMVar5->prep).width;
  pMVar7 = pMVar5;
  RVar11 = iVar2;
  if (((byte)hal_h265e_debug & 4) != 0) {
    _mpp_log_l(4,"hal_h265e_v511","(%d) enter\n",(char *)0x0,0x150);
    RVar11 = (pMVar5->prep).width;
    pMVar7 = ctx->cfg;
  }
  iVar9 = (pMVar5->prep).height;
  vepu541_set_fmt(cfg,(pMVar7->prep).format);
  VVar3 = cfg->format;
  if (VVar3 < VEPU580_FMT_BUTT) {
    uVar13 = (iVar9 + 0xfU & 0xffffff0) * (RVar11 + 0xfU & 0xfffffff0);
    switch(VVar3) {
    case VEPU541_FMT_BGRA8888:
      uVar13 = uVar13 * 4;
      break;
    case VEPU541_FMT_BGR888:
    case VEPU580_FMT_YUV444SP:
    case VEPU580_FMT_YUV444P:
      uVar13 = uVar13 * 3;
      break;
    default:
      uVar13 = uVar13 * 2;
      break;
    case VEPU541_FMT_NONE:
    case VEPU540_FMT_BUTT:
      goto switchD_00253eee_caseD_3;
    case VEPU541_FMT_YUV420SP:
    case VEPU541_FMT_YUV420P:
      uVar13 = uVar13 * 3 >> 1;
      break;
    case VEPU540_FMT_YUV400:
      break;
    }
    uVar14 = iVar2 + 0x1f;
    if (ref == (MppEncRefCfg)0x0) {
      uVar12 = 4;
    }
    else {
      pMVar6 = mpp_enc_ref_cfg_get_cpb_info(ref);
      uVar12 = 4;
      if (2 < pMVar6->dpb_size) {
        uVar12 = (ulong)(pMVar6->dpb_size + 1);
      }
    }
    if ((int)(uVar14 & 0xffffffe0) < 0x1001) {
      clear_ext_line_bufs(ctx);
      if (ctx->ext_line_buf_grp != (MppBufferGroup)0x0) {
        mpp_buffer_group_clear(ctx->ext_line_buf_grp);
        mpp_buffer_group_put(ctx->ext_line_buf_grp);
        ctx->ext_line_buf_grp = (MppBufferGroup)0x0;
      }
      ctx->ext_line_buf_size = 0;
    }
    else {
      uVar14 = (uVar14 >> 5) * 0x1b0 - 0xbdc0 & 0xffffff00;
      if (ctx->ext_line_buf_grp == (MppBufferGroup)0x0) {
        mpp_buffer_group_get
                  (&ctx->ext_line_buf_grp,MPP_BUFFER_TYPE_ION,MPP_BUFFER_INTERNAL,"hal_h265e_v511",
                   "vepu511_h265_setup_hal_bufs");
      }
      else if (uVar14 != ctx->ext_line_buf_size) {
        clear_ext_line_bufs(ctx);
        mpp_buffer_group_clear(ctx->ext_line_buf_grp);
      }
      if ((ctx->ext_line_buf_grp == (MppBufferGroup)0x0) &&
         (_mpp_log_l(2,"hal_h265e_v511","Assertion %s failed at %s:%d\n",(char *)0x0,
                     "ctx->ext_line_buf_grp","vepu511_h265_setup_hal_bufs",0x184),
         (mpp_debug._3_1_ & 0x10) != 0)) {
        abort();
      }
      buffer = ctx->ext_line_bufs;
      for (lVar10 = 0; lVar10 < ctx->task_cnt; lVar10 = lVar10 + 1) {
        if (*buffer == (MppBuffer)0x0) {
          mpp_buffer_get_with_tag
                    (ctx->ext_line_buf_grp,buffer,(long)ctx->ext_line_buf_size,"hal_h265e_v511",
                     "setup_ext_line_bufs");
        }
        buffer = buffer + 1;
      }
      ctx->ext_line_buf_size = uVar14;
    }
    if ((ctx->frame_size < uVar13) || ((int)uVar1 < (int)uVar12)) {
      iVar2 = (pMVar5->prep).width;
      iVar4 = (pMVar5->prep).height;
      hal_bufs_deinit(ctx->dpb_bufs);
      hal_bufs_init(&ctx->dpb_bufs);
      iVar9 = ((iVar9 + 0x3f) / 0x40 + 1) * ((RVar11 + 0x3f) / 0x40);
      uVar14 = iVar9 * 0x40 + 0x1fffU & 0xffffe000;
      ctx->fbc_header_len = uVar14;
      local_58 = (size_t)(int)((iVar9 * 0x3000 >> 1) + uVar14);
      local_50 = (long)(iVar9 * 0x100);
      local_48 = (long)(int)(iVar9 * 0x400 + 0xff0U & 0xfffff000);
      local_40 = (long)(int)(((iVar4 + 0x1f) / 0x20 + 0xfU & 0xffffff0) *
                            ((iVar2 + 0x1f) / 0x20 + 0xfU & 0xfffffff0));
      if ((int)uVar12 <= (int)uVar1) {
        uVar12 = (ulong)uVar1;
      }
      if (((byte)hal_h265e_debug & 8) != 0) {
        _mpp_log_l(4,"hal_h265e_v511","frame size %d -> %d max count %d -> %d\n",(char *)0x0,
                   (ulong)ctx->frame_size,(ulong)uVar13,(ulong)uVar1,uVar12);
      }
      hal_bufs_setup(ctx->dpb_bufs,(RK_S32)uVar12,4,&local_58);
      ctx->frame_size = uVar13;
      ctx->max_buf_cnt = (RK_S32)uVar12;
    }
    MVar8 = MPP_OK;
    if (((byte)hal_h265e_debug & 4) != 0) {
      MVar8 = MPP_OK;
      _mpp_log_l(4,"hal_h265e_v511","(%d) leave\n",(char *)0x0,0x1aa);
    }
  }
  else {
switchD_00253eee_caseD_3:
    _mpp_log_l(2,"hal_h265e_v511","invalid src color space: %d\n","vepu511_h265_setup_hal_bufs");
    MVar8 = MPP_NOK;
  }
  return MVar8;
}

Assistant:

static MPP_RET vepu511_h265_setup_hal_bufs(H265eV511HalContext *ctx)
{
    MPP_RET ret = MPP_OK;
    VepuFmtCfg *fmt = (VepuFmtCfg *)ctx->input_fmt;
    RK_U32 frame_size;
    Vepu541Fmt input_fmt = VEPU541_FMT_YUV420P;
    RK_S32 mb_wd64, mb_h64;
    MppEncRefCfg ref_cfg = ctx->cfg->ref_cfg;
    MppEncPrepCfg *prep = &ctx->cfg->prep;
    RK_S32 old_max_cnt = ctx->max_buf_cnt;
    RK_S32 new_max_cnt = 4;
    RK_S32 alignment = 32;
    RK_S32 aligned_w = MPP_ALIGN(prep->width,  alignment);

    hal_h265e_enter();

    mb_wd64 = (prep->width + 63) / 64;
    mb_h64 = (prep->height + 63) / 64 + 1;

    frame_size = MPP_ALIGN(prep->width, 16) * MPP_ALIGN(prep->height, 16);
    vepu541_set_fmt(fmt, ctx->cfg->prep.format);
    input_fmt = (Vepu541Fmt)fmt->format;
    switch (input_fmt) {
    case VEPU540_FMT_YUV400:
        break;
    case VEPU541_FMT_YUV420P:
    case VEPU541_FMT_YUV420SP: {
        frame_size = frame_size * 3 / 2;
    } break;
    case VEPU541_FMT_YUV422P:
    case VEPU541_FMT_YUV422SP:
    case VEPU541_FMT_YUYV422:
    case VEPU541_FMT_UYVY422:
    case VEPU541_FMT_BGR565: {
        frame_size *= 2;
    } break;
    case VEPU541_FMT_BGR888:
    case VEPU580_FMT_YUV444SP:
    case VEPU580_FMT_YUV444P: {
        frame_size *= 3;
    } break;
    case VEPU541_FMT_BGRA8888: {
        frame_size *= 4;
    } break;
    default: {
        hal_h265e_err("invalid src color space: %d\n", input_fmt);
        return MPP_NOK;
    }
    }

    if (ref_cfg) {
        MppEncCpbInfo *info = mpp_enc_ref_cfg_get_cpb_info(ref_cfg);
        new_max_cnt = MPP_MAX(new_max_cnt, info->dpb_size + 1);
    }

    if (aligned_w > SZ_4K) {
        RK_S32 ctu_w = (aligned_w + 31) / 32;
        RK_S32 ext_line_buf_size = ((ctu_w - 113) * 27 + 15) / 16 * 16 * 16;

        if (NULL == ctx->ext_line_buf_grp)
            mpp_buffer_group_get_internal(&ctx->ext_line_buf_grp, MPP_BUFFER_TYPE_ION);
        else if (ext_line_buf_size != ctx->ext_line_buf_size) {
            clear_ext_line_bufs(ctx);
            mpp_buffer_group_clear(ctx->ext_line_buf_grp);
        }

        mpp_assert(ctx->ext_line_buf_grp);
        setup_ext_line_bufs(ctx);
        ctx->ext_line_buf_size = ext_line_buf_size;
    } else {
        clear_ext_line_bufs(ctx);

        if (ctx->ext_line_buf_grp) {
            mpp_buffer_group_clear(ctx->ext_line_buf_grp);
            mpp_buffer_group_put(ctx->ext_line_buf_grp);
            ctx->ext_line_buf_grp = NULL;
        }
        ctx->ext_line_buf_size = 0;
    }

    if (frame_size > ctx->frame_size || new_max_cnt > old_max_cnt) {
        size_t size[4] = {0};
        RK_S32 ctu_w = (prep->width + 31) / 32;
        RK_S32 ctu_h = (prep->height + 31) / 32;

        hal_bufs_deinit(ctx->dpb_bufs);
        hal_bufs_init(&ctx->dpb_bufs);

        ctx->fbc_header_len = MPP_ALIGN(((mb_wd64 * mb_h64) << 6), SZ_8K);
        size[0] = ctx->fbc_header_len + ((mb_wd64 * mb_h64) << 12) * 3 / 2; //fbc_h + fbc_b
        size[1] = (mb_wd64 * mb_h64 << 8);
        size[2] = MPP_ALIGN(mb_wd64 * mb_h64 * 16 * 4, 256) * 16;
        /* smear bufs */
        size[3] = MPP_ALIGN(ctu_w, 16) * MPP_ALIGN(ctu_h, 16);
        new_max_cnt = MPP_MAX(new_max_cnt, old_max_cnt);

        hal_h265e_dbg_detail("frame size %d -> %d max count %d -> %d\n",
                             ctx->frame_size, frame_size, old_max_cnt, new_max_cnt);

        hal_bufs_setup(ctx->dpb_bufs, new_max_cnt, MPP_ARRAY_ELEMS(size), size);

        ctx->frame_size = frame_size;
        ctx->max_buf_cnt = new_max_cnt;
    }
    hal_h265e_leave();
    return ret;
}